

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# googletest.cc
# Opt level: O2

string * google::protobuf::TestSourceDir_abi_cxx11_(void)

{
  bool bVar1;
  char *__s;
  AlphaNum *b;
  string *in_RDI;
  AlphaNum local_b0;
  AlphaNum local_80;
  string local_50;
  
  __s = getenv("srcdir");
  if (__s == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,".",(allocator<char> *)&local_b0);
    while( true ) {
      b = (AlphaNum *)in_RDI->_M_string_length;
      local_b0.piece_._M_str = (in_RDI->_M_dataplus)._M_p;
      local_b0.piece_._M_len = (size_t)b;
      local_80.piece_ = absl::lts_20250127::NullSafeStringView("/src/google/protobuf/descriptor.cc")
      ;
      absl::lts_20250127::StrCat_abi_cxx11_(&local_50,(lts_20250127 *)&local_b0,&local_80,b);
      bVar1 = File::Exists(&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar1) break;
      bVar1 = File::Exists(in_RDI);
      if (!bVar1) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/googletest.cc"
                   ,0x53);
        absl::lts_20250127::log_internal::LogMessage::operator<<
                  ((LogMessage *)&local_b0,
                   (char (*) [106])
                   "Could not find protobuf source code.  Please run tests from somewhere within the protobuf source package."
                  );
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_b0);
      }
      local_b0.piece_ = absl::lts_20250127::NullSafeStringView("/..");
      absl::lts_20250127::StrAppend(in_RDI,&local_b0);
    }
    local_b0.piece_ = absl::lts_20250127::NullSafeStringView("/src");
    absl::lts_20250127::StrAppend(in_RDI,&local_b0);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)in_RDI,__s,(allocator<char> *)&local_b0);
  }
  return in_RDI;
}

Assistant:

std::string TestSourceDir() {
#ifndef GOOGLE_THIRD_PARTY_PROTOBUF
#ifdef GOOGLE_PROTOBUF_TEST_SOURCE_PATH
  return GOOGLE_PROTOBUF_TEST_SOURCE_PATH;
#else
#ifndef _MSC_VER
  // automake sets the "srcdir" environment variable.
  char* result = getenv("srcdir");
  if (result != nullptr) {
    return result;
  }
#endif  // _MSC_VER

  // Look for the "src" directory.
  std::string prefix = ".";

  // Keep looking further up the directory tree until we find
  // src/.../descriptor.cc. It is important to look for a particular file,
  // keeping in mind that with Bazel builds the directory structure under
  // bazel-bin/ looks similar to the main directory tree in the Git repo.
  while (!File::Exists(
      absl::StrCat(prefix, "/src/google/protobuf/descriptor.cc"))) {
    if (!File::Exists(prefix)) {
      ABSL_LOG(FATAL)
          << "Could not find protobuf source code.  Please run tests from "
             "somewhere within the protobuf source package.";
    }
    absl::StrAppend(&prefix, "/..");
  }
  absl::StrAppend(&prefix, "/src");
  return prefix;
#endif  // GOOGLE_PROTOBUF_TEST_SOURCE_PATH
#else
  return "third_party/protobuf/src";
#endif  // GOOGLE_THIRD_PARTY_PROTOBUF
}